

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokenizer::undefine(CTcTokenizer *this,char *sym,size_t len)

{
  int iVar1;
  undefined4 extraout_var;
  CVmHashEntry *pCVar2;
  CVmHashEntry *entry;
  
  iVar1 = (*this->defines_->_vptr_CTcMacroTable[4])();
  entry = (CVmHashEntry *)CONCAT44(extraout_var,iVar1);
  if (entry != (CVmHashEntry *)0x0) {
    iVar1 = (*entry->_vptr_CVmHashEntry[7])(entry);
    if (iVar1 != 0) {
      (*this->defines_->_vptr_CTcMacroTable[3])(this->defines_,entry);
      pCVar2 = CVmHashTable::find(this->undefs_,sym,len);
      if (pCVar2 != (CVmHashEntry *)0x0) {
        (*entry->_vptr_CVmHashEntry[1])(entry);
        return;
      }
      CVmHashTable::add(this->undefs_,entry);
      return;
    }
  }
  return;
}

Assistant:

void CTcTokenizer::undefine(const char *sym, size_t len)
{
    CTcHashEntryPp *entry;

    /* 
     *   find the macro - if it wasn't defined, silently ignore it, since
     *   it's legal to #undef a symbol that wasn't previously defined 
     */
    entry = find_define(sym, len);
    if (entry != 0 && entry->is_undefable())
    {
        /* remove it */
        defines_->remove(entry);

        /* if it's not already in the #undef table, move it there */
        if (find_undef(sym, len) == 0)
        {
            /* move it to the #undef table */
            undefs_->add(entry);
        }
        else
        {
            /* 
             *   the name is already in the #undef table, so we don't need to
             *   add it again - we can forget about this entry entirely 
             */
            delete entry;
        }
    }
}